

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O0

void __thiscall QPDF::replaceObject(QPDF *this,QPDFObjGen og,QPDFObjectHandle *oh)

{
  bool bVar1;
  logic_error *this_00;
  bool local_72;
  byte local_71;
  byte local_51;
  QPDFObjectHandle local_50;
  QPDFObjGen local_40;
  QPDFObjGen local_28;
  QPDFObjectHandle *local_20;
  QPDFObjectHandle *oh_local;
  QPDF *this_local;
  QPDFObjGen og_local;
  
  local_20 = oh;
  oh_local = (QPDFObjectHandle *)this;
  this_local = (QPDF *)og;
  bVar1 = ::qpdf::BaseHandle::operator_cast_to_bool(&oh->super_BaseHandle);
  local_51 = 1;
  if (bVar1) {
    bVar1 = QPDFObjectHandle::isIndirect(oh);
    local_71 = 0;
    if (bVar1) {
      bVar1 = QPDFObjectHandle::isStream(oh);
      local_72 = false;
      if (bVar1) {
        local_28 = QPDFObjectHandle::getObjGen(oh);
        local_72 = QPDFObjGen::operator==(&local_28,(QPDFObjGen *)&this_local);
      }
      local_71 = local_72 ^ 0xff;
    }
    local_51 = local_71;
  }
  if ((local_51 & 1) != 0) {
    QTC::TC("qpdf","QPDF replaceObject called with indirect object",0);
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"QPDF::replaceObject called with indirect object handle");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  local_40 = (QPDFObjGen)this_local;
  QPDFObjectHandle::getObj(&local_50);
  updateCache(this,local_40,(shared_ptr<QPDFObject> *)&local_50,-1,-1,false);
  std::shared_ptr<QPDFObject>::~shared_ptr((shared_ptr<QPDFObject> *)&local_50);
  return;
}

Assistant:

void
QPDF::replaceObject(QPDFObjGen og, QPDFObjectHandle oh)
{
    if (!oh || (oh.isIndirect() && !(oh.isStream() && oh.getObjGen() == og))) {
        QTC::TC("qpdf", "QPDF replaceObject called with indirect object");
        throw std::logic_error("QPDF::replaceObject called with indirect object handle");
    }
    updateCache(og, oh.getObj(), -1, -1, false);
}